

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O0

void do_cmd_autopickup(command_conflict *cmd)

{
  wchar_t wVar1;
  command_conflict *cmd_local;
  
  wVar1 = do_autopickup(player);
  player->upkeep->energy_use = (wVar1 * (uint)z_info->move_energy) / 10;
  if ((int)(uint)z_info->move_energy < player->upkeep->energy_use) {
    player->upkeep->energy_use = (uint)z_info->move_energy;
  }
  event_signal(EVENT_SEEFLOOR);
  player->upkeep->redraw = player->upkeep->redraw | 0x800000;
  return;
}

Assistant:

void do_cmd_autopickup(struct command *cmd)
{
	/* Get the obvious things */
	player->upkeep->energy_use = do_autopickup(player)
		* z_info->move_energy / 10;
	if (player->upkeep->energy_use > z_info->move_energy)
		player->upkeep->energy_use = z_info->move_energy;

	/* Look at or feel what's left */
	event_signal(EVENT_SEEFLOOR);

	/* Redraw the object list using the upkeep flag so that the update can be
	 * somewhat coalesced. Use event_signal(EVENT_ITEMLIST to force update. */
	player->upkeep->redraw |= (PR_ITEMLIST);
}